

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O2

uint64_t TIFFTileRowSize64(TIFF *tif)

{
  ulong uVar1;
  ulong second;
  char *fmt;
  uint64_t uVar2;
  
  if ((tif->tif_dir).td_tilelength == 0) {
    fmt = "Tile length is zero";
  }
  else {
    uVar1 = (ulong)(tif->tif_dir).td_tilewidth;
    if (uVar1 == 0) {
      fmt = "Tile width is zero";
    }
    else {
      uVar1 = _TIFFMultiply64(tif,(ulong)(tif->tif_dir).td_bitspersample,uVar1,"TIFFTileRowSize");
      if ((tif->tif_dir).td_planarconfig == 1) {
        second = (ulong)(tif->tif_dir).td_samplesperpixel;
        if (second == 0) {
          fmt = "Samples per pixel is zero";
          goto LAB_0026e087;
        }
        uVar1 = _TIFFMultiply64(tif,uVar1,second,"TIFFTileRowSize");
      }
      uVar2 = (ulong)((uVar1 & 7) != 0) + (uVar1 >> 3);
      if (uVar2 != 0) {
        return uVar2;
      }
      fmt = "Computed tile row size is zero";
    }
  }
LAB_0026e087:
  TIFFErrorExtR(tif,"TIFFTileRowSize64",fmt);
  return 0;
}

Assistant:

uint64_t TIFFTileRowSize64(TIFF *tif)
{
    static const char module[] = "TIFFTileRowSize64";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t rowsize;
    uint64_t tilerowsize;

    if (td->td_tilelength == 0)
    {
        TIFFErrorExtR(tif, module, "Tile length is zero");
        return 0;
    }
    if (td->td_tilewidth == 0)
    {
        TIFFErrorExtR(tif, module, "Tile width is zero");
        return (0);
    }
    rowsize = _TIFFMultiply64(tif, td->td_bitspersample, td->td_tilewidth,
                              "TIFFTileRowSize");
    if (td->td_planarconfig == PLANARCONFIG_CONTIG)
    {
        if (td->td_samplesperpixel == 0)
        {
            TIFFErrorExtR(tif, module, "Samples per pixel is zero");
            return 0;
        }
        rowsize = _TIFFMultiply64(tif, rowsize, td->td_samplesperpixel,
                                  "TIFFTileRowSize");
    }
    tilerowsize = TIFFhowmany8_64(rowsize);
    if (tilerowsize == 0)
    {
        TIFFErrorExtR(tif, module, "Computed tile row size is zero");
        return 0;
    }
    return (tilerowsize);
}